

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

void __thiscall
QMimeXMLProvider::addParents(QMimeXMLProvider *this,QString *mime,QStringList *result)

{
  bool bVar1;
  iterator o;
  QList<QString> *this_00;
  long in_FS_OFFSET;
  QString *parent;
  QList<QString> *__range1;
  iterator __end1;
  iterator __begin1;
  parameter_type in_stack_ffffffffffffff58;
  QList<QString> *in_stack_ffffffffffffff60;
  CaseSensitivity in_stack_ffffffffffffff6c;
  QString *in_stack_ffffffffffffff70;
  iterator str;
  QListSpecialMethods<QString> *this_01;
  iterator local_28;
  QListSpecialMethods<QString> local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = local_20;
  QHash<QString,_QList<QString>_>::value
            ((QHash<QString,_QList<QString>_> *)this_01,in_stack_ffffffffffffff70);
  local_28.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<QString>::begin(in_stack_ffffffffffffff60);
  o = QList<QString>::end(in_stack_ffffffffffffff60);
  str = o;
  while( true ) {
    bVar1 = QList<QString>::iterator::operator!=(&local_28,o);
    in_stack_ffffffffffffff6c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff6c);
    if (!bVar1) break;
    this_00 = (QList<QString> *)QList<QString>::iterator::operator*(&local_28);
    bVar1 = QListSpecialMethods<QString>::contains(this_01,str.i,in_stack_ffffffffffffff6c);
    if (!bVar1) {
      QList<QString>::append(this_00,in_stack_ffffffffffffff58);
    }
    QList<QString>::iterator::operator++(&local_28);
  }
  QList<QString>::~QList((QList<QString> *)0x8fe907);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeXMLProvider::addParents(const QString &mime, QStringList &result)
{
    for (const QString &parent : m_parents.value(mime)) {
        if (!result.contains(parent))
            result.append(parent);
    }
}